

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

optional<double> anon_unknown.dwarf_89ecae::qConvertToRealNumber(Private *d)

{
  uint uVar1;
  PrivateShared *extraout_RAX;
  undefined8 uVar2;
  PrivateShared *pPVar3;
  PrivateShared *extraout_RAX_00;
  PrivateShared *extraout_RAX_01;
  long in_FS_OFFSET;
  float fVar4;
  _Storage<double,_true> _Var5;
  _Storage<double,_true> extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  optional<long_long> oVar7;
  optional<double> oVar8;
  bool ok;
  bool local_21;
  _Storage<long_long,_true> local_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = true;
  uVar1 = *(uint *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 0xc);
  pPVar3 = (PrivateShared *)(ulong)uVar1;
  switch(uVar1) {
  case 3:
  case 5:
switchD_002a52a8_caseD_3:
    pPVar3 = (PrivateShared *)qMetaTypeUNumber(d);
    auVar6._8_4_ = (int)((ulong)pPVar3 >> 0x20);
    auVar6._0_8_ = pPVar3;
    auVar6._12_4_ = 0x45300000;
    _Var5._M_value =
         (auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)pPVar3) - 4503599627370496.0);
    break;
  case 4:
  case 7:
  case 8:
  case 9:
switchD_002a52a8_caseD_4:
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    oVar7 = qConvertToNumber(d,false);
    local_20._M_value =
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    local_18 = (undefined1 *)
               CONCAT71(local_18._1_7_,
                        oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
    _Var5 = extraout_XMM0_Qa;
    if (((undefined1  [16])
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    {
LAB_002a535e:
      uVar2 = 0;
      goto LAB_002a52d3;
    }
    pPVar3 = (PrivateShared *)
             std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_20);
    _Var5._M_value = (double)(long)*pPVar3;
    break;
  case 6:
    pPVar3 = (PrivateShared *)&switchD_002a52a8::switchdataD_004714e0;
    if ((d->field_0x18 & 1) != 0) {
      pPVar3 = (d->data).shared;
      d = (Private *)
          ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int>._M_i + (long)pPVar3->offset);
    }
    _Var5 = *(_Storage<double,_true> *)d;
    break;
  case 10:
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    _Var5._M_value = QString::toDouble((QString *)d,&local_21);
    pPVar3 = extraout_RAX_00;
    if (local_21 == false) goto LAB_002a535e;
    break;
  default:
    if ((uVar1 - 0x23 < 3) || (uVar1 - 0x38 < 2)) goto switchD_002a52a8_caseD_3;
    if (uVar1 == 0x26) {
      if ((d->field_0x18 & 1) != 0) {
        pPVar3 = (d->data).shared;
        d = (Private *)
            ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i + (long)pPVar3->offset);
      }
      _Var5._M_value = (double)*(float *)&d->data;
    }
    else if (uVar1 == 0x2d) {
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      _Var5._M_value = QJsonValue::toDouble((QJsonValue *)d,0.0);
      pPVar3 = extraout_RAX_01;
    }
    else {
      if (uVar1 == 0x35) {
        if ((d->field_0x18 & 1) != 0) {
          pPVar3 = (d->data).shared;
          d = (Private *)
              ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                      _q_value.super___atomic_base<int>._M_i + (long)pPVar3->offset);
        }
        uVar2 = CONCAT71((int7)((ulong)pPVar3 >> 8),1);
        if (*(int *)((long)d + 0x10) == 0) {
          _Var5._M_value = (double)*(_Storage<double,_true> *)d;
        }
        else {
          _Var5._M_value = 0.0;
          if (*(int *)((long)d + 0x10) == 0x202) {
            _Var5 = *(_Storage<double,_true> *)d;
          }
        }
        goto LAB_002a52d3;
      }
      if (uVar1 != 0x3f) goto switchD_002a52a8_caseD_4;
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      fVar4 = qfloat16::operator_cast_to_float((qfloat16 *)d);
      _Var5._M_value = (double)fVar4;
      pPVar3 = extraout_RAX;
    }
  }
  uVar2 = CONCAT71((int7)((ulong)pPVar3 >> 8),1);
LAB_002a52d3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  oVar8.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar2;
  oVar8.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = _Var5._M_value;
  return (optional<double>)
         oVar8.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> qConvertToRealNumber(const QVariant::Private *d)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString:
        if (double r = d->get<QString>().toDouble(&ok); ok)
            return r;
        return std::nullopt;
    case QMetaType::Double:
        return d->get<double>();
    case QMetaType::Float:
        return double(d->get<float>());
    case QMetaType::Float16:
        return double(d->get<qfloat16>());
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return double(qMetaTypeUNumber(d));
    case QMetaType::QCborValue:
        return d->get<QCborValue>().toDouble();
    case QMetaType::QJsonValue:
        return d->get<QJsonValue>().toDouble();
    default:
        // includes enum conversion as well as invalid types
        if (std::optional<qlonglong> l = qConvertToNumber(d))
            return double(*l);
        return std::nullopt;
    }
}